

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O1

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::loadDesc(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,Desc *ds)

{
  DataKey *pDVar1;
  double dVar2;
  SPxOut *pSVar3;
  SPxId *pSVar4;
  pointer pnVar5;
  pointer pnVar6;
  char cVar7;
  bool bVar8;
  Status SVar9;
  int iVar10;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar11;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long in_FS_OFFSET;
  Verbosity old_verbosity;
  cpp_dec_float<200U,_int,_void> local_1c8;
  undefined4 local_148;
  uint uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  pSVar3 = this->spxout;
  if ((pSVar3 != (SPxOut *)0x0) && (4 < (int)pSVar3->m_verbosity)) {
    local_1c8.data._M_elems[0] = pSVar3->m_verbosity;
    local_138.data._M_elems[0] = 5;
    (*pSVar3->_vptr_SPxOut[2])();
    pSVar3 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity],
               "IBASIS02 loading of Basis invalidates factorization",0x33);
    cVar7 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18) +
                    cVar7);
    std::ostream::put(cVar7);
    std::ostream::flush();
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,(DataKey *)&local_1c8);
  }
  (this->lastin).super_DataKey = (DataKey)0xffffffff00000000;
  (this->lastout).super_DataKey = (DataKey)0xffffffff00000000;
  this->lastidx = -1;
  iVar14 = 0;
  this->iterCount = 0;
  this->updateCount = 0;
  if (&this->thedesc != ds) {
    Desc::operator=(&this->thedesc,ds);
    setRep(this);
  }
  this->nzCount = 0;
  pSVar12 = this->theLP;
  iVar10 = (pSVar12->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  bVar8 = iVar10 < 1;
  if (0 < iVar10) {
    dVar2 = *(double *)(in_FS_OFFSET + -8);
    local_148 = SUB84(dVar2,0);
    uStack_144 = (uint)((ulong)dVar2 >> 0x20) ^ 0x80000000;
    uStack_140 = 0;
    uStack_13c = 0x80000000;
    lVar16 = 0;
    lVar15 = 0;
    iVar14 = 0;
    do {
      if ((this->thedesc).rowstat.data[lVar15] < ~P_FREE) {
        pnVar5 = (pSVar12->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((*(int *)((long)(&(pnVar5->m_backend).data + 1) + lVar16 + 8U) == 2) ||
            (pnVar6 = (pSVar12->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            *(int *)((long)(&(pnVar6->m_backend).data + 1) + lVar16 + 8U) == 2)) ||
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)
                                ((long)(pnVar5->m_backend).data._M_elems + lVar16),
                                (cpp_dec_float<200U,_int,_void> *)
                                ((long)(pnVar6->m_backend).data._M_elems + lVar16)), iVar10 != 0)) {
          pnVar5 = (this->theLP->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_138.fpclass = cpp_dec_float_finite;
          local_138.prec_elem = 0x1c;
          local_138.data._M_elems[0] = 0;
          local_138.data._M_elems[1] = 0;
          local_138.data._M_elems[2] = 0;
          local_138.data._M_elems[3] = 0;
          local_138.data._M_elems[4] = 0;
          local_138.data._M_elems[5] = 0;
          local_138.data._M_elems[6] = 0;
          local_138.data._M_elems[7] = 0;
          local_138.data._M_elems[8] = 0;
          local_138.data._M_elems[9] = 0;
          local_138.data._M_elems[10] = 0;
          local_138.data._M_elems[0xb] = 0;
          local_138.data._M_elems[0xc] = 0;
          local_138.data._M_elems[0xd] = 0;
          local_138.data._M_elems[0xe] = 0;
          local_138.data._M_elems[0xf] = 0;
          local_138.data._M_elems[0x10] = 0;
          local_138.data._M_elems[0x11] = 0;
          local_138.data._M_elems[0x12] = 0;
          local_138.data._M_elems[0x13] = 0;
          local_138.data._M_elems[0x14] = 0;
          local_138.data._M_elems[0x15] = 0;
          local_138.data._M_elems[0x16] = 0;
          local_138.data._M_elems[0x17] = 0;
          local_138.data._M_elems[0x18] = 0;
          local_138.data._M_elems[0x19] = 0;
          local_138.data._M_elems._104_5_ = 0;
          local_138.data._M_elems[0x1b]._1_3_ = 0;
          local_138.exp = 0;
          local_138.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_138,
                     (double)CONCAT44(uStack_144,local_148));
          if (((*(int *)((long)(&(pnVar5->m_backend).data + 1) + lVar16 + 8U) != 2) &&
              (local_138.fpclass != cpp_dec_float_NaN)) &&
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)
                                  ((long)(pnVar5->m_backend).data._M_elems + lVar16),&local_138),
             0 < iVar10)) {
            pnVar5 = (this->theLP->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 0x1c;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems[6] = 0;
            local_b8.data._M_elems[7] = 0;
            local_b8.data._M_elems[8] = 0;
            local_b8.data._M_elems[9] = 0;
            local_b8.data._M_elems[10] = 0;
            local_b8.data._M_elems[0xb] = 0;
            local_b8.data._M_elems[0xc] = 0;
            local_b8.data._M_elems[0xd] = 0;
            local_b8.data._M_elems[0xe] = 0;
            local_b8.data._M_elems[0xf] = 0;
            local_b8.data._M_elems[0x10] = 0;
            local_b8.data._M_elems[0x11] = 0;
            local_b8.data._M_elems[0x12] = 0;
            local_b8.data._M_elems[0x13] = 0;
            local_b8.data._M_elems[0x14] = 0;
            local_b8.data._M_elems[0x15] = 0;
            local_b8.data._M_elems[0x16] = 0;
            local_b8.data._M_elems[0x17] = 0;
            local_b8.data._M_elems[0x18] = 0;
            local_b8.data._M_elems[0x19] = 0;
            local_b8.data._M_elems._104_5_ = 0;
            local_b8.data._M_elems[0x1b]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_b8,dVar2);
            if ((((*(int *)((long)(&(pnVar5->m_backend).data + 1) + lVar16 + 8U) != 2) &&
                 (local_b8.fpclass != cpp_dec_float_NaN)) &&
                (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     ((long)(pnVar5->m_backend).data._M_elems + lVar16),&local_b8),
                -1 < iVar10)) || (SVar9 = (this->thedesc).rowstat.data[lVar15], SVar9 == P_ON_LOWER)
               ) {
LAB_004fbace:
              SVar9 = P_ON_LOWER;
              goto LAB_004fbada;
            }
            if ((SVar9 != P_ON_UPPER) &&
               (pnVar5 = (this->theLP->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .object.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               *(int *)((long)(&(pnVar5->m_backend).data + 1) + lVar16 + 8U) != 2)) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_1c8,0,(type *)0x0);
              iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)
                                  ((long)(pnVar5->m_backend).data._M_elems + lVar16),&local_1c8);
              if (iVar10 < 1) goto LAB_004fbace;
            }
          }
          pnVar5 = (this->theLP->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_1c8.fpclass = cpp_dec_float_finite;
          local_1c8.prec_elem = 0x1c;
          local_1c8.data._M_elems[0] = 0;
          local_1c8.data._M_elems[1] = 0;
          local_1c8.data._M_elems[2] = 0;
          local_1c8.data._M_elems[3] = 0;
          local_1c8.data._M_elems[4] = 0;
          local_1c8.data._M_elems[5] = 0;
          local_1c8.data._M_elems[6] = 0;
          local_1c8.data._M_elems[7] = 0;
          local_1c8.data._M_elems[8] = 0;
          local_1c8.data._M_elems[9] = 0;
          local_1c8.data._M_elems[10] = 0;
          local_1c8.data._M_elems[0xb] = 0;
          local_1c8.data._M_elems[0xc] = 0;
          local_1c8.data._M_elems[0xd] = 0;
          local_1c8.data._M_elems[0xe] = 0;
          local_1c8.data._M_elems[0xf] = 0;
          local_1c8.data._M_elems[0x10] = 0;
          local_1c8.data._M_elems[0x11] = 0;
          local_1c8.data._M_elems[0x12] = 0;
          local_1c8.data._M_elems[0x13] = 0;
          local_1c8.data._M_elems[0x14] = 0;
          local_1c8.data._M_elems[0x15] = 0;
          local_1c8.data._M_elems[0x16] = 0;
          local_1c8.data._M_elems[0x17] = 0;
          local_1c8.data._M_elems[0x18] = 0;
          local_1c8.data._M_elems[0x19] = 0;
          local_1c8.data._M_elems._104_5_ = 0;
          local_1c8.data._M_elems[0x1b]._1_3_ = 0;
          local_1c8.exp = 0;
          local_1c8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_1c8,dVar2);
          if (((*(int *)((long)(&(pnVar5->m_backend).data + 1) + lVar16 + 8U) == 2) ||
              (local_1c8.fpclass == cpp_dec_float_NaN)) ||
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)
                                  ((long)(pnVar5->m_backend).data._M_elems + lVar16),&local_1c8),
             -1 < iVar10)) {
            SVar9 = P_FREE;
          }
          else {
            SVar9 = P_ON_UPPER;
          }
        }
        else {
          SVar9 = P_FIXED;
        }
      }
      else {
        SVar9 = dualRowStatus(this,(int)lVar15);
      }
LAB_004fbada:
      (this->thedesc).rowstat.data[lVar15] = SVar9;
      if (0 < SVar9 * this->theLP->theRep) {
        if (iVar14 == (this->matrix).thesize) break;
        local_138.data._M_elems._0_8_ =
             (this->theLP->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey[lVar15];
        SPxRowId::SPxRowId((SPxRowId *)&local_1c8,(DataKey *)&local_138);
        pSVar4 = (this->theBaseId).data;
        pDVar1 = &pSVar4[iVar14].super_DataKey;
        pDVar1->info = local_1c8.data._M_elems[0];
        pDVar1->idx = local_1c8.data._M_elems[1];
        pSVar4[iVar14].super_DataKey.info = -1;
        pSVar11 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::vector(this->theLP,(SPxRowId *)&local_1c8);
        (this->matrix).data[iVar14] = pSVar11;
        this->nzCount = this->nzCount + (this->matrix).data[iVar14]->memused;
        iVar14 = iVar14 + 1;
      }
      lVar15 = lVar15 + 1;
      pSVar12 = this->theLP;
      lVar13 = (long)(pSVar12->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum;
      lVar16 = lVar16 + 0x80;
      bVar8 = lVar13 <= lVar15;
    } while (lVar15 < lVar13);
  }
  pSVar12 = this->theLP;
  if (0 < (pSVar12->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    dVar2 = *(double *)(in_FS_OFFSET + -8);
    local_148 = SUB84(dVar2,0);
    uStack_144 = (uint)((ulong)dVar2 >> 0x20) ^ 0x80000000;
    uStack_140 = 0;
    uStack_13c = 0x80000000;
    lVar16 = 0;
    lVar15 = 0;
    do {
      if ((this->thedesc).colstat.data[lVar15] < ~P_FREE) {
        pnVar5 = (pSVar12->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((*(int *)((long)(&(pnVar5->m_backend).data + 1) + lVar16 + 8U) == 2) ||
            (pnVar6 = (pSVar12->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            *(int *)((long)(&(pnVar6->m_backend).data + 1) + lVar16 + 8U) == 2)) ||
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)
                                ((long)(pnVar5->m_backend).data._M_elems + lVar16),
                                (cpp_dec_float<200U,_int,_void> *)
                                ((long)(pnVar6->m_backend).data._M_elems + lVar16)), iVar10 != 0)) {
          pnVar5 = (this->theLP->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_138.fpclass = cpp_dec_float_finite;
          local_138.prec_elem = 0x1c;
          local_138.data._M_elems[0] = 0;
          local_138.data._M_elems[1] = 0;
          local_138.data._M_elems[2] = 0;
          local_138.data._M_elems[3] = 0;
          local_138.data._M_elems[4] = 0;
          local_138.data._M_elems[5] = 0;
          local_138.data._M_elems[6] = 0;
          local_138.data._M_elems[7] = 0;
          local_138.data._M_elems[8] = 0;
          local_138.data._M_elems[9] = 0;
          local_138.data._M_elems[10] = 0;
          local_138.data._M_elems[0xb] = 0;
          local_138.data._M_elems[0xc] = 0;
          local_138.data._M_elems[0xd] = 0;
          local_138.data._M_elems[0xe] = 0;
          local_138.data._M_elems[0xf] = 0;
          local_138.data._M_elems[0x10] = 0;
          local_138.data._M_elems[0x11] = 0;
          local_138.data._M_elems[0x12] = 0;
          local_138.data._M_elems[0x13] = 0;
          local_138.data._M_elems[0x14] = 0;
          local_138.data._M_elems[0x15] = 0;
          local_138.data._M_elems[0x16] = 0;
          local_138.data._M_elems[0x17] = 0;
          local_138.data._M_elems[0x18] = 0;
          local_138.data._M_elems[0x19] = 0;
          local_138.data._M_elems._104_5_ = 0;
          local_138.data._M_elems[0x1b]._1_3_ = 0;
          local_138.exp = 0;
          local_138.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_138,
                     (double)CONCAT44(uStack_144,local_148));
          if (((*(int *)((long)(&(pnVar5->m_backend).data + 1) + lVar16 + 8U) != 2) &&
              (local_138.fpclass != cpp_dec_float_NaN)) &&
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)
                                  ((long)(pnVar5->m_backend).data._M_elems + lVar16),&local_138),
             0 < iVar10)) {
            pnVar5 = (this->theLP->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 0x1c;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems[6] = 0;
            local_b8.data._M_elems[7] = 0;
            local_b8.data._M_elems[8] = 0;
            local_b8.data._M_elems[9] = 0;
            local_b8.data._M_elems[10] = 0;
            local_b8.data._M_elems[0xb] = 0;
            local_b8.data._M_elems[0xc] = 0;
            local_b8.data._M_elems[0xd] = 0;
            local_b8.data._M_elems[0xe] = 0;
            local_b8.data._M_elems[0xf] = 0;
            local_b8.data._M_elems[0x10] = 0;
            local_b8.data._M_elems[0x11] = 0;
            local_b8.data._M_elems[0x12] = 0;
            local_b8.data._M_elems[0x13] = 0;
            local_b8.data._M_elems[0x14] = 0;
            local_b8.data._M_elems[0x15] = 0;
            local_b8.data._M_elems[0x16] = 0;
            local_b8.data._M_elems[0x17] = 0;
            local_b8.data._M_elems[0x18] = 0;
            local_b8.data._M_elems[0x19] = 0;
            local_b8.data._M_elems._104_5_ = 0;
            local_b8.data._M_elems[0x1b]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_b8,dVar2);
            if ((((*(int *)((long)(&(pnVar5->m_backend).data + 1) + lVar16 + 8U) != 2) &&
                 (local_b8.fpclass != cpp_dec_float_NaN)) &&
                (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     ((long)(pnVar5->m_backend).data._M_elems + lVar16),&local_b8),
                -1 < iVar10)) || (SVar9 = (this->thedesc).colstat.data[lVar15], SVar9 == P_ON_LOWER)
               ) {
LAB_004fbe76:
              SVar9 = P_ON_LOWER;
              goto LAB_004fbe82;
            }
            if ((SVar9 != P_ON_UPPER) &&
               (pnVar5 = (this->theLP->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .object.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               *(int *)((long)(&(pnVar5->m_backend).data + 1) + lVar16 + 8U) != 2)) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_1c8,0,(type *)0x0);
              iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)
                                  ((long)(pnVar5->m_backend).data._M_elems + lVar16),&local_1c8);
              if (iVar10 < 1) goto LAB_004fbe76;
            }
          }
          pnVar5 = (this->theLP->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_1c8.fpclass = cpp_dec_float_finite;
          local_1c8.prec_elem = 0x1c;
          local_1c8.data._M_elems[0] = 0;
          local_1c8.data._M_elems[1] = 0;
          local_1c8.data._M_elems[2] = 0;
          local_1c8.data._M_elems[3] = 0;
          local_1c8.data._M_elems[4] = 0;
          local_1c8.data._M_elems[5] = 0;
          local_1c8.data._M_elems[6] = 0;
          local_1c8.data._M_elems[7] = 0;
          local_1c8.data._M_elems[8] = 0;
          local_1c8.data._M_elems[9] = 0;
          local_1c8.data._M_elems[10] = 0;
          local_1c8.data._M_elems[0xb] = 0;
          local_1c8.data._M_elems[0xc] = 0;
          local_1c8.data._M_elems[0xd] = 0;
          local_1c8.data._M_elems[0xe] = 0;
          local_1c8.data._M_elems[0xf] = 0;
          local_1c8.data._M_elems[0x10] = 0;
          local_1c8.data._M_elems[0x11] = 0;
          local_1c8.data._M_elems[0x12] = 0;
          local_1c8.data._M_elems[0x13] = 0;
          local_1c8.data._M_elems[0x14] = 0;
          local_1c8.data._M_elems[0x15] = 0;
          local_1c8.data._M_elems[0x16] = 0;
          local_1c8.data._M_elems[0x17] = 0;
          local_1c8.data._M_elems[0x18] = 0;
          local_1c8.data._M_elems[0x19] = 0;
          local_1c8.data._M_elems._104_5_ = 0;
          local_1c8.data._M_elems[0x1b]._1_3_ = 0;
          local_1c8.exp = 0;
          local_1c8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_1c8,dVar2);
          if (((*(int *)((long)(&(pnVar5->m_backend).data + 1) + lVar16 + 8U) == 2) ||
              (local_1c8.fpclass == cpp_dec_float_NaN)) ||
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)
                                  ((long)(pnVar5->m_backend).data._M_elems + lVar16),&local_1c8),
             -1 < iVar10)) {
            SVar9 = P_FREE;
          }
          else {
            SVar9 = P_ON_UPPER;
          }
        }
        else {
          SVar9 = P_FIXED;
        }
      }
      else {
        SVar9 = dualColStatus(this,(int)lVar15);
      }
LAB_004fbe82:
      (this->thedesc).colstat.data[lVar15] = SVar9;
      if (0 < SVar9 * this->theLP->theRep) {
        if (iVar14 == (this->matrix).thesize) {
          bVar8 = false;
          break;
        }
        local_138.data._M_elems._0_8_ =
             (this->theLP->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey[lVar15];
        SPxColId::SPxColId((SPxColId *)&local_1c8,(DataKey *)&local_138);
        pSVar4 = (this->theBaseId).data;
        pDVar1 = &pSVar4[iVar14].super_DataKey;
        pDVar1->info = local_1c8.data._M_elems[0];
        pDVar1->idx = local_1c8.data._M_elems[1];
        pSVar4[iVar14].super_DataKey.info = 1;
        pSVar11 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::vector(this->theLP,(SPxColId *)&local_1c8);
        (this->matrix).data[iVar14] = pSVar11;
        this->nzCount = this->nzCount + (this->matrix).data[iVar14]->memused;
        iVar14 = iVar14 + 1;
      }
      lVar15 = lVar15 + 1;
      pSVar12 = this->theLP;
      lVar16 = lVar16 + 0x80;
    } while (lVar15 < (pSVar12->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  if ((bVar8) && ((this->matrix).thesize <= iVar14)) {
    this->matrixIsSetup = true;
  }
  else {
    restoreInitialBasis(this);
  }
  this->factorized = false;
  if (this->factor !=
      (SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    (*this->factor->_vptr_SLinSolver[2])();
  }
  return;
}

Assistant:

void SPxBasisBase<R>::loadDesc(const Desc& ds)
{
   assert(status() > NO_PROBLEM);
   assert(theLP != nullptr);
   assert(ds.nRows() == theLP->nRows());
   assert(ds.nCols() == theLP->nCols());

   SPxId none;
   int   i;
   int   j;
   bool consistent = true;

   SPX_MSG_INFO3((*this->spxout),
                 (*this->spxout) << "IBASIS02 loading of Basis invalidates factorization"
                 << std::endl;)

   lastin      = none;
   lastout     = none;
   lastidx     = -1;
   iterCount   = 0;
   updateCount = 0;

   if(&ds != &thedesc)
   {
      thedesc = ds;
      setRep();
   }

   assert(theLP->dim() == matrix.size());

   nzCount = 0;

   for(j = i = 0; i < theLP->nRows(); ++i)
   {
      /* for columns and rows with D_... status, the correct D_... status depends on bounds and sides; if a basis
       * descriptor is loaded after changing bounds or sides, e.g. in the refine() method, we have to correct them
       */
      if(thedesc.rowStatus(i) >= 0)
         thedesc.rowStatus(i) = dualRowStatus(i);
      else if(theLP->SPxLPBase<R>::lhs(i) == theLP->SPxLPBase<R>::rhs(i))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lhs(i) > R(-infinity)
              && (theLP->SPxLPBase<R>::rhs(i) >= R(infinity)
                  || thedesc.rowStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || (thedesc.rowStatus(i) != SPxBasisBase<R>::Desc::P_ON_UPPER
                      && theLP->SPxLPBase<R>::maxRowObj(i) <= 0)))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      else if(theLP->SPxLPBase<R>::rhs(i) < R(infinity))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      else
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_FREE;

      if(theLP->isBasic(thedesc.rowStatus(i)))
      {
         assert(theLP->dim() == matrix.size());
         assert(j <= matrix.size());

         if(j == matrix.size())
         {
            // too many basic variables
            consistent = false;
            break;
         }

         SPxRowId id = theLP->SPxLPBase<R>::rId(i);
         theBaseId[j] = id;
         matrix[j] = &theLP->vector(id);
         nzCount += matrix[j++]->size();
      }
   }

   for(i = 0; i < theLP->nCols(); ++i)
   {
      /* for columns and rows with D_... status, the correct D_... status depends on bounds and sides; if a basis
       * descriptor is loaded after changing bounds or sides, e.g. in the refine() method, we have to correct them
       */
      if(thedesc.colStatus(i) >= 0)
         thedesc.colStatus(i) = dualColStatus(i);
      else if(theLP->SPxLPBase<R>::lower(i) == theLP->SPxLPBase<R>::upper(i))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lower(i) > R(-infinity)
              && (theLP->SPxLPBase<R>::upper(i) >= R(infinity)
                  || thedesc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || (thedesc.colStatus(i) != SPxBasisBase<R>::Desc::P_ON_UPPER
                      && theLP->SPxLPBase<R>::maxObj(i) <= 0)))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      else if(theLP->SPxLPBase<R>::upper(i) < R(infinity))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      else
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_FREE;

      if(theLP->isBasic(thedesc.colStatus(i)))
      {
         assert(theLP->dim() == matrix.size());
         assert(j <= matrix.size());

         if(j == matrix.size())
         {
            // too many basic variables
            consistent = false;
            break;
         }

         SPxColId id = theLP->SPxLPBase<R>::cId(i);
         theBaseId[j] = id;
         matrix[j] = &theLP->vector(id);
         nzCount += matrix[j++]->size();
      }
   }

   if(j < matrix.size())
      consistent = false;  // not enough basic variables

   /* if dimensions are inconsistent, restore slack basis
    * if dimensions are consistent, then we have setup a correct matrix
    */
   if(!consistent)
      restoreInitialBasis();
   else
      matrixIsSetup = true;

   assert(isDescValid(thedesc));

   factorized = false;

   if(factor != nullptr)
      factor->clear();
}